

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O3

QRect __thiscall
QProxyStyle::itemTextRect
          (QProxyStyle *this,QFontMetrics *fm,QRect *r,int flags,bool enabled,QString *text)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  undefined7 in_register_00000081;
  QRect QVar2;
  
  this_00 = *(QProxyStylePrivate **)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  QVar2 = (QRect)(**(code **)(*(long *)pQVar1 + 0x88))
                           (pQVar1,fm,r,flags,CONCAT71(in_register_00000081,enabled) & 0xffffffff,
                            text);
  return QVar2;
}

Assistant:

QRect QProxyStyle::itemTextRect(const QFontMetrics &fm, const QRect &r, int flags, bool enabled, const QString &text) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->itemTextRect(fm, r, flags, enabled, text);
}